

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eln.c
# Opt level: O2

wchar_t el_get(EditLine *el,wchar_t op,...)

{
  el_pfunc_t *prf;
  undefined1 *puVar1;
  char in_AL;
  wchar_t wVar2;
  el_pfunc_t p_Var3;
  undefined8 in_RCX;
  el_pfunc_t *in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  wchar_t wStackY_120;
  va_list ap;
  wchar_t wc;
  el_pfunc_t *local_f0;
  el_pfunc_t *local_c8;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  puVar1 = local_c0;
  prf = local_c8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (el == (EditLine *)0x0) {
    return L'\xffffffff';
  }
  wVar2 = L'\xffffffff';
  local_c8 = in_RDX;
  local_c0 = (undefined1 *)in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  switch(op) {
  case L'\0':
  case L'\f':
    wVar2 = prompt_get(el,prf,(wchar_t *)0x0,op);
    break;
  case L'\x01':
    wStackY_120 = L'\x01';
    op = wStackY_120;
    goto LAB_00108882;
  case L'\x02':
    wVar2 = el_wget(el,L'\x02',&wc);
    p_Var3 = (el_pfunc_t)ct_encode_string((wchar_t *)_wc,&el->el_lgcyconv);
    *prf = p_Var3;
    wVar2 = -(uint)((el->el_lgcyconv).csize == 0) | wVar2;
    break;
  case L'\x03':
  case L'\v':
  case L'\x0f':
  case L'\x10':
  case L'\x19':
    goto LAB_00108882;
  case L'\r':
    wStackY_120 = L'\r';
    op = wStackY_120;
    goto LAB_00108882;
  case L'\x0e':
    wStackY_120 = L'\x0e';
    op = wStackY_120;
LAB_00108882:
    wVar2 = el_wget(el,op,prf);
    break;
  case L'\x11':
    _wc = el_get::gettc;
    local_f0 = in_RDX;
    wVar2 = terminal_gettc(el,L'\x03',(char **)&wc);
    break;
  case L'\x12':
    wVar2 = el_wget(el,L'\x12',(ulong)in_RDX & 0xffffffff,puVar1,in_R8,in_R9,0x3000000020,
                    &stack0x00000008);
    break;
  case L'\x15':
  case L'\x16':
    _wc = (char *)((ulong)_wc & 0xffffffff00000000);
    wVar2 = prompt_get(el,in_RDX,&wc,op);
    *puVar1 = (undefined1)wc;
  }
  return wVar2;
}

Assistant:

int
el_get(EditLine *el, int op, ...)
{
	va_list ap;
	int ret;

	if (!el)
		return -1;

	va_start(ap, op);

	switch (op) {
	case EL_PROMPT:         /* el_pfunc_t * */
	case EL_RPROMPT: {
		el_pfunc_t *p = va_arg(ap, el_pfunc_t *);
		ret = prompt_get(el, p, 0, op);
		break;
	}

	case EL_PROMPT_ESC: /* el_pfunc_t *, char **/
	case EL_RPROMPT_ESC: {
		el_pfunc_t *p = va_arg(ap, el_pfunc_t *);
		char *c = va_arg(ap, char *);
		wchar_t wc = 0;
		ret = prompt_get(el, p, &wc, op);
		*c = (char)wc;
		break;
	}

	case EL_EDITOR: {
		const char **p = va_arg(ap, const char **);
		const wchar_t *pw;
		ret = el_wget(el, op, &pw);
		*p = ct_encode_string(pw, &el->el_lgcyconv);
		if (!el->el_lgcyconv.csize)
			ret = -1;
		break;
	}

	case EL_TERMINAL:       /* const char ** */
		ret = el_wget(el, op, va_arg(ap, const char **));
		break;

	case EL_SIGNAL:         /* int * */
	case EL_EDITMODE:
	case EL_SAFEREAD:
	case EL_UNBUFFERED:
	case EL_PREP_TERM:
		ret = el_wget(el, op, va_arg(ap, int *));
		break;

	case EL_GETTC: {
		char *argv[3];
		static char gettc[] = "gettc";
		argv[0] = gettc;
		argv[1] = va_arg(ap, char *);
		argv[2] = va_arg(ap, void *);
		ret = terminal_gettc(el, 3, argv);
		break;
	}

	case EL_GETCFN:         /* el_rfunc_t */
		ret = el_wget(el, op, va_arg(ap, el_rfunc_t *));
		break;

	case EL_CLIENTDATA:     /* void ** */
		ret = el_wget(el, op, va_arg(ap, void **));
		break;

	case EL_GETFP: {          /* int, FILE ** */
		int what = va_arg(ap, int);
		FILE **fpp = va_arg(ap, FILE **);
		ret = el_wget(el, op, what, fpp);
		break;
	}

	default:
		ret = -1;
		break;
	}

	va_end(ap);
	return ret;
}